

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

void set_col_as_taken<InputData<float,long>>
               (vector<bool,_std::allocator<bool>_> *col_is_taken,
               robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *col_is_taken_s,InputData<float,_long> *input_data,size_t col_num,ColType col_type)

{
  bool bVar1;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  value_type *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  _Bit_reference in_stack_ffffffffffffffc8;
  
  bVar1 = std::vector<bool,_std::allocator<bool>_>::empty(in_RSI);
  if (bVar1) {
    tsl::
    robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
    ::insert((robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  }
  else {
    std::vector<bool,_std::allocator<bool>_>::operator[]
              ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffc8._M_mask,
               (size_type)in_stack_ffffffffffffffc8._M_p);
    std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffc8,true);
  }
  return;
}

Assistant:

void set_col_as_taken(std::vector<bool> &col_is_taken, hashed_set<size_t> &col_is_taken_s,
                      InputData &input_data, size_t col_num, ColType col_type)
{
    col_num += ((col_type == Numeric)? 0 : input_data.ncols_numeric);
    if (!col_is_taken.empty())
        col_is_taken[col_num] = true;
    else
        col_is_taken_s.insert(col_num);
}